

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_fragment_two_pass.c
# Opt level: O3

void BrotliCompressFragmentTwoPass
               (MemoryManager *m,uint8_t *input,size_t input_size,int is_last,uint32_t *command_buf,
               uint8_t *literal_buf,int *table,size_t table_size,size_t *storage_ix,uint8_t *storage
               )

{
  ulong uVar1;
  int iVar2;
  uint8_t *in_RAX;
  int is_last_00;
  ulong uVar3;
  uint uVar4;
  
  uVar3 = *storage_ix;
  iVar2 = 0x1f;
  if ((uint)table_size != 0) {
    for (; (uint)table_size >> iVar2 == 0; iVar2 = iVar2 + -1) {
    }
  }
  is_last_00 = (int)command_buf;
  switch(iVar2) {
  case 8:
    BrotliCompressFragmentTwoPassImpl8
              (m,input,input_size,is_last_00,(uint32_t *)literal_buf,(uint8_t *)table,
               (int *)storage_ix,(size_t *)storage,in_RAX);
    break;
  case 9:
    BrotliCompressFragmentTwoPassImpl9
              (m,input,input_size,is_last_00,(uint32_t *)literal_buf,(uint8_t *)table,
               (int *)storage_ix,(size_t *)storage,in_RAX);
    break;
  case 10:
    BrotliCompressFragmentTwoPassImpl10
              (m,input,input_size,is_last_00,(uint32_t *)literal_buf,(uint8_t *)table,
               (int *)storage_ix,(size_t *)storage,in_RAX);
    break;
  case 0xb:
    BrotliCompressFragmentTwoPassImpl11
              (m,input,input_size,is_last_00,(uint32_t *)literal_buf,(uint8_t *)table,
               (int *)storage_ix,(size_t *)storage,in_RAX);
    break;
  case 0xc:
    BrotliCompressFragmentTwoPassImpl12
              (m,input,input_size,is_last_00,(uint32_t *)literal_buf,(uint8_t *)table,
               (int *)storage_ix,(size_t *)storage,in_RAX);
    break;
  case 0xd:
    BrotliCompressFragmentTwoPassImpl13
              (m,input,input_size,is_last_00,(uint32_t *)literal_buf,(uint8_t *)table,
               (int *)storage_ix,(size_t *)storage,in_RAX);
    break;
  case 0xe:
    BrotliCompressFragmentTwoPassImpl14
              (m,input,input_size,is_last_00,(uint32_t *)literal_buf,(uint8_t *)table,
               (int *)storage_ix,(size_t *)storage,in_RAX);
    break;
  case 0xf:
    BrotliCompressFragmentTwoPassImpl15
              (m,input,input_size,is_last_00,(uint32_t *)literal_buf,(uint8_t *)table,
               (int *)storage_ix,(size_t *)storage,in_RAX);
    break;
  case 0x10:
    BrotliCompressFragmentTwoPassImpl16
              (m,input,input_size,is_last_00,(uint32_t *)literal_buf,(uint8_t *)table,
               (int *)storage_ix,(size_t *)storage,in_RAX);
    break;
  case 0x11:
    BrotliCompressFragmentTwoPassImpl17
              (m,input,input_size,is_last_00,(uint32_t *)literal_buf,(uint8_t *)table,
               (int *)storage_ix,(size_t *)storage,in_RAX);
  }
  if (input_size * 8 + 0x1f < *storage_ix - uVar3) {
    storage[uVar3 >> 3] = storage[uVar3 >> 3] & ~(-1 << ((byte)uVar3 & 7));
    *storage_ix = uVar3;
    BrotliStoreMetaBlockHeader(input_size,1,storage_ix,storage);
    uVar4 = (int)*storage_ix + 7;
    *storage_ix = (ulong)(uVar4 & 0xfffffff8);
    memcpy(storage + (uVar4 >> 3),input,input_size);
    uVar3 = input_size * 8 + *storage_ix;
    *storage_ix = uVar3;
    storage[uVar3 >> 3] = '\0';
  }
  if (is_last != 0) {
    uVar1 = *storage_ix;
    *(ulong *)(storage + (uVar1 >> 3)) = (ulong)storage[uVar1 >> 3] | 1L << ((byte)uVar1 & 7);
    uVar3 = uVar1 + 1;
    *storage_ix = uVar3;
    *(ulong *)(storage + (uVar3 >> 3)) = (ulong)storage[uVar3 >> 3] | 1L << ((byte)uVar3 & 7);
    *storage_ix = (ulong)((int)uVar1 + 9U & 0xfffffff8);
  }
  return;
}

Assistant:

void BrotliCompressFragmentTwoPass(
    MemoryManager* m, const uint8_t* input, size_t input_size,
    BROTLI_BOOL is_last, uint32_t* command_buf, uint8_t* literal_buf,
    int* table, size_t table_size, size_t* storage_ix, uint8_t* storage) {
  const size_t initial_storage_ix = *storage_ix;
  const size_t table_bits = Log2FloorNonZero(table_size);
  switch (table_bits) {
#define CASE_(B)                                      \
    case B:                                           \
      BrotliCompressFragmentTwoPassImpl ## B(         \
          m, input, input_size, is_last, command_buf, \
          literal_buf, table, storage_ix, storage);   \
      break;
    FOR_TABLE_BITS_(CASE_)
#undef CASE_
    default: BROTLI_DCHECK(0); break;
  }

  /* If output is larger than single uncompressed block, rewrite it. */
  if (*storage_ix - initial_storage_ix > 31 + (input_size << 3)) {
    RewindBitPosition(initial_storage_ix, storage_ix, storage);
    EmitUncompressedMetaBlock(input, input_size, storage_ix, storage);
  }

  if (is_last) {
    BrotliWriteBits(1, 1, storage_ix, storage);  /* islast */
    BrotliWriteBits(1, 1, storage_ix, storage);  /* isempty */
    *storage_ix = (*storage_ix + 7u) & ~7u;
  }
}